

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3BeginTrigger(Parse *pParse,Token *pName1,Token *pName2,int tr_tm,int op,IdList *pColumns
                        ,SrcList *pTableName,Expr *pWhen,int isTemp,int noErr)

{
  undefined1 *puVar1;
  byte bVar2;
  sqlite3 *db;
  Db *pDVar3;
  Schema *pSVar4;
  Token *pName_00;
  uint iDb;
  int iVar5;
  int iVar6;
  Table *pTVar7;
  char *pcVar8;
  HashElem *pHVar9;
  Trigger *pTrigger;
  RenameToken *pRVar10;
  Schema **ppSVar11;
  char *pcVar12;
  char *pcVar13;
  Token *pName;
  DbFixer sFix;
  Expr *local_140;
  Token *local_128;
  char *local_120;
  Parse *local_118;
  Walker local_110;
  Schema *local_e0;
  undefined1 local_d8;
  char *local_d0;
  char *local_c8;
  Token *local_c0;
  Select local_b8;
  
  local_140 = pWhen;
  db = pParse->db;
  if (isTemp != 0) {
    if (pName2->n == 0) {
      iDb = 1;
      local_128 = pName1;
      if (pTableName != (SrcList *)0x0) goto LAB_00168901;
      goto LAB_00168974;
    }
    pcVar8 = (char *)0x0;
    sqlite3ErrorMsg(pParse,"temporary trigger may not have qualified name");
LAB_001688b2:
    pTrigger = (Trigger *)0x0;
    goto LAB_0016897d;
  }
  iDb = sqlite3TwoPartName(pParse,pName1,pName2,&local_128);
  if (pTableName == (SrcList *)0x0 || (int)iDb < 0) {
LAB_00168974:
    pcVar8 = (char *)0x0;
  }
  else {
LAB_00168901:
    if (db->mallocFailed != '\0') goto LAB_00168974;
    if ((iDb != 1) && ((db->init).busy != '\0')) {
      pcVar8 = pTableName->a[0].zDatabase;
      if (pcVar8 != (char *)0x0) {
        sqlite3DbFreeNN(db,pcVar8);
      }
      pTableName->a[0].zDatabase = (char *)0x0;
    }
    pTVar7 = sqlite3SrcListLookup(pParse,pTableName);
    pName_00 = local_128;
    if ((((db->init).busy == '\0') && (pTVar7 != (Table *)0x0 && pName2->n == 0)) &&
       (pTVar7->pSchema == db->aDb[1].pSchema)) {
      iDb = 1;
    }
    if (db->mallocFailed != '\0') goto LAB_00168974;
    local_110.u.pNC = (NameContext *)&local_118;
    pDVar3 = pParse->db->aDb;
    local_d0 = pDVar3[(int)iDb].zDbSName;
    local_e0 = pDVar3[(int)iDb].pSchema;
    local_c8 = "trigger";
    local_c0 = local_128;
    local_d8 = iDb == 1;
    local_110.xExprCallback = fixExprCb;
    local_110.xSelectCallback = fixSelectCb;
    local_110.xSelectCallback2 = sqlite3WalkWinDefnDummyCallback;
    local_110.walkerDepth = 0;
    local_110.eCode = 0;
    local_118 = pParse;
    local_110.pParse = pParse;
    if (pTableName != (SrcList *)0x0) {
      local_b8.pEList = (ExprList *)0x0;
      local_b8.pWin = (Window *)0x0;
      local_b8.pWinDefn = (Window *)0x0;
      local_b8.pLimit = (Expr *)0x0;
      local_b8.pWith = (With *)0x0;
      local_b8.pPrior = (Select *)0x0;
      local_b8.pNext = (Select *)0x0;
      local_b8.pHaving = (Expr *)0x0;
      local_b8.pOrderBy = (ExprList *)0x0;
      local_b8.pWhere = (Expr *)0x0;
      local_b8.pGroupBy = (ExprList *)0x0;
      local_b8.selId = 0;
      local_b8.addrOpenEphm[0] = 0;
      local_b8.addrOpenEphm[1] = 0;
      local_b8._28_4_ = 0;
      local_b8.op = '\0';
      local_b8._1_1_ = 0;
      local_b8.nSelectRow = 0;
      local_b8.selFlags = 0;
      local_b8.iLimit = 0;
      local_b8.iOffset = 0;
      local_b8.pSrc = pTableName;
      iVar5 = sqlite3WalkSelect(&local_110,&local_b8);
      if (iVar5 != 0) goto LAB_00168974;
    }
    pTVar7 = sqlite3SrcListLookup(pParse,pTableName);
    if (pTVar7 == (Table *)0x0) {
      pcVar8 = (char *)0x0;
      goto LAB_00168aee;
    }
    if (pTVar7->eTabType == '\x01') {
      pcVar13 = "cannot create triggers on virtual tables";
LAB_00168ae2:
      pcVar8 = (char *)0x0;
      sqlite3ErrorMsg(pParse,pcVar13);
LAB_00168aee:
      if ((db->init).iDb == '\x01') {
        puVar1 = &(db->init).field_0x6;
        *puVar1 = *puVar1 | 1;
      }
      goto LAB_001688b2;
    }
    if (((pTVar7->tabFlags & 0x1000) != 0) && (iVar5 = sqlite3ReadOnlyShadowTables(db), iVar5 != 0))
    {
      pcVar13 = "cannot create triggers on shadow tables";
      goto LAB_00168ae2;
    }
    pcVar8 = sqlite3NameFromToken(db,pName_00);
    if (pcVar8 == (char *)0x0) goto LAB_00168974;
    iVar5 = sqlite3CheckObjectName(pParse,pcVar8,"trigger",pTVar7->zName);
    if (iVar5 == 0) {
      bVar2 = pParse->eParseMode;
      if ((bVar2 < 2) &&
         (pHVar9 = findElementWithHash(&(db->aDb[iDb].pSchema)->trigHash,pcVar8,(uint *)0x0),
         pHVar9->data != (void *)0x0)) {
        if (noErr == 0) {
          sqlite3ErrorMsg(pParse,"trigger %T already exists",pName_00);
        }
        else {
          sqlite3CodeVerifySchema(pParse,iDb);
        }
        goto LAB_00168979;
      }
      local_120 = pTVar7->zName;
      iVar5 = sqlite3_strnicmp(local_120,"sqlite_",7);
      if (iVar5 == 0) {
        sqlite3ErrorMsg(pParse,"cannot create trigger on system table");
        goto LAB_00168979;
      }
      if (tr_tm == 0x41 || pTVar7->eTabType != '\x02') {
        if (tr_tm != 0x41 || pTVar7->eTabType == '\x02') {
          if (bVar2 < 2) {
            if (pTVar7->pSchema == (Schema *)0x0) {
              iVar5 = -0x8000;
            }
            else {
              iVar5 = -1;
              ppSVar11 = &db->aDb->pSchema;
              do {
                iVar5 = iVar5 + 1;
                pSVar4 = *ppSVar11;
                ppSVar11 = ppSVar11 + 4;
              } while (pSVar4 != pTVar7->pSchema);
            }
            pcVar13 = db->aDb[iVar5].zDbSName;
            pcVar12 = pcVar13;
            if (isTemp != 0) {
              pcVar12 = db->aDb[1].zDbSName;
            }
            iVar6 = 5;
            if (isTemp == 0) {
              iVar6 = (iVar5 != 1) + 5 + (uint)(iVar5 != 1);
            }
            iVar6 = sqlite3AuthCheck(pParse,iVar6,pcVar8,local_120,pcVar12);
            if (iVar6 == 0) {
              pcVar12 = "sqlite_master";
              if (iVar5 == 1) {
                pcVar12 = "sqlite_temp_master";
              }
              iVar5 = sqlite3AuthCheck(pParse,0x12,pcVar12,(char *)0x0,pcVar13);
              if (iVar5 == 0) goto LAB_00168c79;
            }
          }
          else {
LAB_00168c79:
            pTrigger = (Trigger *)sqlite3DbMallocZero(db,0x48);
            if (pTrigger != (Trigger *)0x0) {
              pTrigger->zName = pcVar8;
              pcVar8 = sqlite3DbStrDup(db,pTableName->a[0].zName);
              pTrigger->table = pcVar8;
              pTrigger->pSchema = db->aDb[iDb].pSchema;
              pTrigger->pTabSchema = pTVar7->pSchema;
              pTrigger->op = (u8)op;
              pTrigger->tr_tm = '\x02' - ((tr_tm - 0x21U & 0xffffffdf) == 0);
              if (pParse->eParseMode < 2) {
                if (pWhen == (Expr *)0x0) {
                  pWhen = (Expr *)0x0;
                }
                else {
                  pWhen = exprDup(db,pWhen,1,(EdupBuf *)0x0);
                }
              }
              else {
                pRVar10 = pParse->pRename;
                if (pRVar10 != (RenameToken *)0x0) {
                  do {
                    if ((char *)pRVar10->p == pTableName->a[0].zName) {
                      pRVar10->p = pcVar8;
                      break;
                    }
                    pRVar10 = pRVar10->pNext;
                  } while (pRVar10 != (RenameToken *)0x0);
                }
                local_140 = (Expr *)0x0;
              }
              pTrigger->pWhen = pWhen;
              pTrigger->pColumns = pColumns;
              pParse->pNewTrigger = pTrigger;
              pcVar8 = (char *)0x0;
              pColumns = (IdList *)0x0;
              goto LAB_0016897d;
            }
          }
          goto LAB_00168979;
        }
        sqlite3ErrorMsg(pParse,"cannot create INSTEAD OF trigger on table: %S",pTableName->a);
      }
      else {
        pcVar13 = "AFTER";
        if (tr_tm == 0x21) {
          pcVar13 = "BEFORE";
        }
        sqlite3ErrorMsg(pParse,"cannot create %s trigger on view: %S",pcVar13,pTableName->a);
      }
      goto LAB_00168aee;
    }
  }
LAB_00168979:
  pTrigger = (Trigger *)0x0;
LAB_0016897d:
  if (pcVar8 != (char *)0x0) {
    sqlite3DbFreeNN(db,pcVar8);
  }
  sqlite3SrcListDelete(db,pTableName);
  sqlite3IdListDelete(db,pColumns);
  if (local_140 != (Expr *)0x0) {
    sqlite3ExprDeleteNN(db,local_140);
  }
  if (pParse->pNewTrigger == (Trigger *)0x0) {
    sqlite3DeleteTrigger(db,pTrigger);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3BeginTrigger(
  Parse *pParse,      /* The parse context of the CREATE TRIGGER statement */
  Token *pName1,      /* The name of the trigger */
  Token *pName2,      /* The name of the trigger */
  int tr_tm,          /* One of TK_BEFORE, TK_AFTER, TK_INSTEAD */
  int op,             /* One of TK_INSERT, TK_UPDATE, TK_DELETE */
  IdList *pColumns,   /* column list if this is an UPDATE OF trigger */
  SrcList *pTableName,/* The name of the table/view the trigger applies to */
  Expr *pWhen,        /* WHEN clause */
  int isTemp,         /* True if the TEMPORARY keyword is present */
  int noErr           /* Suppress errors if the trigger already exists */
){
  Trigger *pTrigger = 0;  /* The new trigger */
  Table *pTab;            /* Table that the trigger fires off of */
  char *zName = 0;        /* Name of the trigger */
  sqlite3 *db = pParse->db;  /* The database connection */
  int iDb;                /* The database to store the trigger in */
  Token *pName;           /* The unqualified db name */
  DbFixer sFix;           /* State vector for the DB fixer */

  assert( pName1!=0 );   /* pName1->z might be NULL, but not pName1 itself */
  assert( pName2!=0 );
  assert( op==TK_INSERT || op==TK_UPDATE || op==TK_DELETE );
  assert( op>0 && op<0xff );
  if( isTemp ){
    /* If TEMP was specified, then the trigger name may not be qualified. */
    if( pName2->n>0 ){
      sqlite3ErrorMsg(pParse, "temporary trigger may not have qualified name");
      goto trigger_cleanup;
    }
    iDb = 1;
    pName = pName1;
  }else{
    /* Figure out the db that the trigger will be created in */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ){
      goto trigger_cleanup;
    }
  }
  if( !pTableName || db->mallocFailed ){
    goto trigger_cleanup;
  }

  /* A long-standing parser bug is that this syntax was allowed:
  **
  **    CREATE TRIGGER attached.demo AFTER INSERT ON attached.tab ....
  **                                                 ^^^^^^^^
  **
  ** To maintain backwards compatibility, ignore the database
  ** name on pTableName if we are reparsing out of the schema table
  */
  if( db->init.busy && iDb!=1 ){
    sqlite3DbFree(db, pTableName->a[0].zDatabase);
    pTableName->a[0].zDatabase = 0;
  }

  /* If the trigger name was unqualified, and the table is a temp table,
  ** then set iDb to 1 to create the trigger in the temporary database.
  ** If sqlite3SrcListLookup() returns 0, indicating the table does not
  ** exist, the error is caught by the block below.
  */
  pTab = sqlite3SrcListLookup(pParse, pTableName);
  if( db->init.busy==0 && pName2->n==0 && pTab
        && pTab->pSchema==db->aDb[1].pSchema ){
    iDb = 1;
  }

  /* Ensure the table name matches database name and that the table exists */
  if( db->mallocFailed ) goto trigger_cleanup;
  assert( pTableName->nSrc==1 );
  sqlite3FixInit(&sFix, pParse, iDb, "trigger", pName);
  if( sqlite3FixSrcList(&sFix, pTableName) ){
    goto trigger_cleanup;
  }
  pTab = sqlite3SrcListLookup(pParse, pTableName);
  if( !pTab ){
    /* The table does not exist. */
    goto trigger_orphan_error;
  }
  if( IsVirtual(pTab) ){
    sqlite3ErrorMsg(pParse, "cannot create triggers on virtual tables");
    goto trigger_orphan_error;
  }
  if( (pTab->tabFlags & TF_Shadow)!=0 && sqlite3ReadOnlyShadowTables(db) ){
    sqlite3ErrorMsg(pParse, "cannot create triggers on shadow tables");
    goto trigger_orphan_error;
  }

  /* Check that the trigger name is not reserved and that no trigger of the
  ** specified name exists */
  zName = sqlite3NameFromToken(db, pName);
  if( zName==0 ){
    assert( db->mallocFailed );
    goto trigger_cleanup;
  }
  if( sqlite3CheckObjectName(pParse, zName, "trigger", pTab->zName) ){
    goto trigger_cleanup;
  }
  assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
  if( !IN_RENAME_OBJECT ){
    if( sqlite3HashFind(&(db->aDb[iDb].pSchema->trigHash),zName) ){
      if( !noErr ){
        sqlite3ErrorMsg(pParse, "trigger %T already exists", pName);
      }else{
        assert( !db->init.busy );
        sqlite3CodeVerifySchema(pParse, iDb);
        VVA_ONLY( pParse->ifNotExists = 1; )
      }
      goto trigger_cleanup;
    }
  }

  /* Do not create a trigger on a system table */
  if( sqlite3StrNICmp(pTab->zName, "sqlite_", 7)==0 ){
    sqlite3ErrorMsg(pParse, "cannot create trigger on system table");
    goto trigger_cleanup;
  }

  /* INSTEAD of triggers are only for views and views only support INSTEAD
  ** of triggers.
  */
  if( IsView(pTab) && tr_tm!=TK_INSTEAD ){
    sqlite3ErrorMsg(pParse, "cannot create %s trigger on view: %S",
        (tr_tm == TK_BEFORE)?"BEFORE":"AFTER", pTableName->a);
    goto trigger_orphan_error;
  }
  if( !IsView(pTab) && tr_tm==TK_INSTEAD ){
    sqlite3ErrorMsg(pParse, "cannot create INSTEAD OF"
        " trigger on table: %S", pTableName->a);
    goto trigger_orphan_error;
  }

#ifndef SQLITE_OMIT_AUTHORIZATION
  if( !IN_RENAME_OBJECT ){
    int iTabDb = sqlite3SchemaToIndex(db, pTab->pSchema);
    int code = SQLITE_CREATE_TRIGGER;
    const char *zDb = db->aDb[iTabDb].zDbSName;
    const char *zDbTrig = isTemp ? db->aDb[1].zDbSName : zDb;
    if( iTabDb==1 || isTemp ) code = SQLITE_CREATE_TEMP_TRIGGER;
    if( sqlite3AuthCheck(pParse, code, zName, pTab->zName, zDbTrig) ){
      goto trigger_cleanup;
    }
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(iTabDb),0,zDb)){
      goto trigger_cleanup;
    }
  }
#endif

  /* INSTEAD OF triggers can only appear on views and BEFORE triggers
  ** cannot appear on views.  So we might as well translate every
  ** INSTEAD OF trigger into a BEFORE trigger.  It simplifies code
  ** elsewhere.
  */
  if (tr_tm == TK_INSTEAD){
    tr_tm = TK_BEFORE;
  }

  /* Build the Trigger object */
  pTrigger = (Trigger*)sqlite3DbMallocZero(db, sizeof(Trigger));
  if( pTrigger==0 ) goto trigger_cleanup;
  pTrigger->zName = zName;
  zName = 0;
  pTrigger->table = sqlite3DbStrDup(db, pTableName->a[0].zName);
  pTrigger->pSchema = db->aDb[iDb].pSchema;
  pTrigger->pTabSchema = pTab->pSchema;
  pTrigger->op = (u8)op;
  pTrigger->tr_tm = tr_tm==TK_BEFORE ? TRIGGER_BEFORE : TRIGGER_AFTER;
  if( IN_RENAME_OBJECT ){
    sqlite3RenameTokenRemap(pParse, pTrigger->table, pTableName->a[0].zName);
    pTrigger->pWhen = pWhen;
    pWhen = 0;
  }else{
    pTrigger->pWhen = sqlite3ExprDup(db, pWhen, EXPRDUP_REDUCE);
  }
  pTrigger->pColumns = pColumns;
  pColumns = 0;
  assert( pParse->pNewTrigger==0 );
  pParse->pNewTrigger = pTrigger;

trigger_cleanup:
  sqlite3DbFree(db, zName);
  sqlite3SrcListDelete(db, pTableName);
  sqlite3IdListDelete(db, pColumns);
  sqlite3ExprDelete(db, pWhen);
  if( !pParse->pNewTrigger ){
    sqlite3DeleteTrigger(db, pTrigger);
  }else{
    assert( pParse->pNewTrigger==pTrigger );
  }
  return;

trigger_orphan_error:
  if( db->init.iDb==1 ){
    /* Ticket #3810.
    ** Normally, whenever a table is dropped, all associated triggers are
    ** dropped too.  But if a TEMP trigger is created on a non-TEMP table
    ** and the table is dropped by a different database connection, the
    ** trigger is not visible to the database connection that does the
    ** drop so the trigger cannot be dropped.  This results in an
    ** "orphaned trigger" - a trigger whose associated table is missing.
    **
    ** 2020-11-05 see also https://sqlite.org/forum/forumpost/157dc791df
    */
    db->init.orphanTrigger = 1;
  }
  goto trigger_cleanup;
}